

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O1

_Bool EverCrypt_DRBG_generate
                (uint8_t *output,EverCrypt_DRBG_state_s *st,uint32_t n,uint8_t *additional_input,
                uint32_t additional_input_len)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  undefined8 dst;
  uint *puVar8;
  _Bool _Var9;
  char cVar10;
  uint32_t len;
  uint extraout_EDX;
  undefined8 uVar11;
  uint32_t *dst_00;
  uint8_t *puVar12;
  EverCrypt_DRBG_state_s *pEVar13;
  uint8_t *puVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint8_t *puVar19;
  uint uVar20;
  EverCrypt_DRBG_state_s *pEVar21;
  ulong uVar22;
  uint32_t auStack_c8 [2];
  EverCrypt_DRBG_state_s EStack_c0;
  uint32_t *puStack_a0;
  uint8_t *puStack_98;
  uint32_t *puStack_90;
  uint8_t *puStack_88;
  long lStack_80;
  uint8_t *puStack_78;
  uint8_t *puStack_70;
  ulong uStack_68;
  uint *puStack_60;
  uint8_t *puStack_58;
  EverCrypt_DRBG_state_s *pEStack_50;
  EverCrypt_DRBG_state_s *pEStack_48;
  char cStack_39;
  
  switch(st->tag) {
  case '\0':
    _Var9 = generate_sha1(output,st,n,additional_input,additional_input_len);
    return _Var9;
  case '\x01':
    _Var9 = generate_sha2_256(output,st,n,additional_input,additional_input_len);
    return _Var9;
  case '\x02':
    _Var9 = generate_sha2_384(output,st,n,additional_input,additional_input_len);
    return _Var9;
  case '\x03':
    _Var9 = generate_sha2_512(output,st,n,additional_input,additional_input_len);
    return _Var9;
  }
  EverCrypt_DRBG_generate_cold_1();
  pEStack_48 = &EStack_c0;
  cVar10 = '\0';
  if ((additional_input_len <= Hacl_HMAC_DRBG_max_additional_input_length) &&
     (cVar10 = '\0', extraout_EDX <= Hacl_HMAC_DRBG_max_output_length)) {
    uVar17 = (ulong)additional_input_len;
    lStack_80 = CONCAT44(lStack_80._4_4_,extraout_EDX);
    auStack_c8[0] = 0x177188;
    auStack_c8[1] = 0;
    puStack_78 = output;
    pEStack_50 = st;
    len = Hacl_HMAC_DRBG_min_length('\x04');
    uVar15 = (ulong)len;
    lVar16 = -(uVar15 + 0xf & 0xfffffffffffffff0);
    puVar19 = (uint8_t *)((long)&EStack_c0 + lVar16);
    *(undefined8 *)((long)auStack_c8 + lVar16) = 0x1771af;
    memset(puVar19,0,uVar15);
    *(undefined8 *)((long)auStack_c8 + lVar16) = 0x1771ba;
    cVar10 = Lib_RandomBuffer_System_randombytes(puVar19,len);
    if ((bool)cVar10) {
      puStack_88 = (pEStack_50->field_1).case_SHA1_s.k;
      EStack_c0.field_1.case_SHA1_s.k = (pEStack_50->field_1).case_SHA1_s.v;
      puStack_90 = (pEStack_50->field_1).case_SHA1_s.reseed_counter;
      uVar22 = (ulong)(len + additional_input_len);
      puStack_58 = (uint8_t *)CONCAT71(puStack_58._1_7_,pEStack_50->tag);
      lVar16 = -(uVar22 + 0xf & 0xfffffffffffffff0);
      pEVar21 = (EverCrypt_DRBG_state_s *)(puVar19 + lVar16);
      cStack_39 = cVar10;
      puStack_60 = (uint *)uVar22;
      builtin_memcpy(puVar19 + lVar16 + -8,"\fr\x17",4);
      *(uint8_t *)((long)pEVar21 + -4) = '\0';
      *(uint8_t *)((long)pEVar21 + -3) = '\0';
      *(uint8_t *)((long)pEVar21 + -2) = '\0';
      *(uint8_t *)((long)pEVar21 + -1) = '\0';
      memset(pEVar21,0,uVar22);
      builtin_memcpy(puVar19 + lVar16 + -8,"\x1ar\x17",4);
      *(uint8_t *)((long)pEVar21 + -4) = '\0';
      *(uint8_t *)((long)pEVar21 + -3) = '\0';
      *(uint8_t *)((long)pEVar21 + -2) = '\0';
      *(uint8_t *)((long)pEVar21 + -1) = '\0';
      memcpy(pEVar21,puVar19,uVar15);
      uStack_68 = uVar17;
      puStack_70 = additional_input;
      puStack_98 = (uint8_t *)pEVar21;
      builtin_memcpy(puVar19 + lVar16 + -8,"8r\x17",4);
      *(uint8_t *)((long)pEVar21 + -4) = '\0';
      *(uint8_t *)((long)pEVar21 + -3) = '\0';
      *(uint8_t *)((long)pEVar21 + -2) = '\0';
      *(uint8_t *)((long)pEVar21 + -1) = '\0';
      memcpy((uint8_t *)((long)pEVar21 + uVar15),additional_input,uVar17);
      if ((char)puStack_58 != '\0') {
        uVar11 = 0x3c0;
LAB_001777ec:
        pEVar21[-1].field_1.case_SHA1_s.reseed_counter = (uint32_t *)0x1777f3;
        printf("KaRaMeL abort at %s:%d\n%s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
               ,uVar11,"unreachable (pattern matches are exhaustive in F*)");
        pEVar21[-1].field_1.case_SHA1_s.reseed_counter = (uint32_t *)generate_sha2_256;
        exit(0xff);
      }
      uVar18 = len + additional_input_len + 0x15;
      uVar15 = (ulong)uVar18;
      uVar22 = uVar15 + 0xf & 0xfffffffffffffff0;
      dst_00 = (uint32_t *)((long)pEVar21 + -uVar22);
      puStack_58 = (uint8_t *)uVar17;
      dst_00[-2] = 0x17726f;
      dst_00[-1] = 0;
      memset(dst_00,0,uVar15);
      dst = EStack_c0.field_1.case_SHA1_s.k;
      *(undefined4 *)((uint8_t *)((long)pEVar21 + 0x10) + (long)-uVar22) =
           *(undefined4 *)(EStack_c0.field_1.case_SHA1_s.k + 0x10);
      uVar11 = *(undefined8 *)(EStack_c0.field_1.case_SHA1_s.k + 8);
      *(undefined8 *)dst_00 = *(undefined8 *)EStack_c0.field_1.case_SHA1_s.k;
      *(undefined8 *)(dst_00 + 2) = uVar11;
      puVar8 = puStack_60;
      puVar19 = puStack_98;
      if (puStack_60 == (uint *)0x0) {
        *(uint8_t *)(dst_00 + 5) = '\0';
        puVar19 = puStack_88;
        dst_00[-2] = 0x1773c6;
        dst_00[-1] = 0;
        EverCrypt_HMAC_compute_sha1((uint8_t *)dst_00,puVar19,0x14,(uint8_t *)dst_00,uVar18);
        dst_00[-2] = 0x1773df;
        dst_00[-1] = 0;
        EverCrypt_HMAC_compute_sha1((uint8_t *)dst,(uint8_t *)dst_00,0x14,(uint8_t *)dst,0x14);
        *(uint32_t *)(puVar19 + 0x10) = dst_00[4];
        uVar11 = *(undefined8 *)(dst_00 + 2);
        *(undefined8 *)puVar19 = *(undefined8 *)dst_00;
        *(undefined8 *)(puVar19 + 8) = uVar11;
      }
      else {
        EStack_c0.field_1.case_SHA1_s.v = (uint8_t *)-uVar22;
        dst_00[-2] = 0x1772b3;
        dst_00[-1] = 0;
        memcpy((uint8_t *)((long)dst_00 + 0x15),puVar19,(size_t)puVar8);
        *(uint8_t *)(dst_00 + 5) = '\0';
        puVar14 = puStack_88;
        dst_00[-2] = 0x1772d1;
        dst_00[-1] = 0;
        EverCrypt_HMAC_compute_sha1((uint8_t *)dst_00,puVar14,0x14,(uint8_t *)dst_00,uVar18);
        dst_00[-2] = 0x1772ea;
        dst_00[-1] = 0;
        EverCrypt_HMAC_compute_sha1((uint8_t *)dst,(uint8_t *)dst_00,0x14,(uint8_t *)dst,0x14);
        EStack_c0.field_1.case_SHA1_s.reseed_counter = dst_00;
        *(uint32_t *)(puVar14 + 0x10) = dst_00[4];
        uVar11 = *(undefined8 *)(dst_00 + 2);
        *(undefined8 *)puVar14 = *(undefined8 *)dst_00;
        *(undefined8 *)(puVar14 + 8) = uVar11;
        puVar12 = (uint8_t *)((long)dst_00 - uVar22);
        puStack_a0 = dst_00;
        puVar12[-8] = '\x1e';
        puVar12[-7] = 's';
        puVar12[-6] = '\x17';
        puVar12[-5] = '\0';
        puVar12[-4] = '\0';
        puVar12[-3] = '\0';
        puVar12[-2] = '\0';
        puVar12[-1] = '\0';
        memset(puVar12,0,uVar15);
        uVar11 = *(undefined8 *)(dst + 8);
        *(undefined8 *)puVar12 = *(undefined8 *)dst;
        *(undefined8 *)(puVar12 + 8) = uVar11;
        *(undefined4 *)(puVar12 + 0x10) = *(undefined4 *)(dst + 0x10);
        puVar8 = puStack_60;
        puVar19 = puStack_98;
        puVar12[-8] = 'A';
        puVar12[-7] = 's';
        puVar12[-6] = '\x17';
        puVar12[-5] = '\0';
        puVar12[-4] = '\0';
        puVar12[-3] = '\0';
        puVar12[-2] = '\0';
        puVar12[-1] = '\0';
        memcpy(puVar12 + 0x15,puVar19,(size_t)puVar8);
        puVar12[0x14] = '\x01';
        puVar12[-8] = '[';
        puVar12[-7] = 's';
        puVar12[-6] = '\x17';
        puVar12[-5] = '\0';
        puVar12[-4] = '\0';
        puVar12[-3] = '\0';
        puVar12[-2] = '\0';
        puVar12[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar12,puVar14,0x14,puVar12,uVar18);
        puVar12[-8] = 't';
        puVar12[-7] = 's';
        puVar12[-6] = '\x17';
        puVar12[-5] = '\0';
        puVar12[-4] = '\0';
        puVar12[-3] = '\0';
        puVar12[-2] = '\0';
        puVar12[-1] = '\0';
        EverCrypt_HMAC_compute_sha1((uint8_t *)dst,puVar12,0x14,(uint8_t *)dst,0x14);
        *(undefined4 *)(puVar14 + 0x10) = *(undefined4 *)(puVar12 + 0x10);
        uVar11 = *(undefined8 *)
                  ((uint8_t *)((long)puStack_a0 + (long)EStack_c0.field_1.case_SHA1_s.v) + 8);
        *(undefined8 *)puVar14 =
             *(undefined8 *)((long)puStack_a0 + (long)EStack_c0.field_1.case_SHA1_s.v);
        *(undefined8 *)(puVar14 + 8) = uVar11;
      }
      *puStack_90 = 1;
      uVar18 = (uint)lStack_80;
      if (cStack_39 == '\0') {
        cVar10 = '\0';
      }
      else {
        if (pEStack_50->tag != '\0') {
          uVar11 = 0x3f9;
          pEVar21 = pEStack_48;
          goto LAB_001777ec;
        }
        puStack_60 = (pEStack_50->field_1).case_SHA1_s.reseed_counter;
        cVar10 = *puStack_60 <= Hacl_HMAC_DRBG_reseed_interval;
        if (*puStack_60 <= Hacl_HMAC_DRBG_reseed_interval) {
          pEVar21 = (EverCrypt_DRBG_state_s *)(pEStack_50->field_1).case_SHA1_s.k;
          puVar19 = (pEStack_50->field_1).case_SHA1_s.v;
          pEVar13 = pEStack_48;
          if ((int)puStack_58 != 0) {
            pEStack_50 = pEStack_48;
            uVar20 = (int)puStack_58 + 0x15;
            uVar17 = (ulong)uVar20;
            uVar15 = uVar17 + 0xf & 0xfffffffffffffff0;
            puVar14 = (uint8_t *)((long)pEStack_48 - uVar15);
            puVar14[-8] = 'q';
            puVar14[-7] = 't';
            puVar14[-6] = '\x17';
            puVar14[-5] = '\0';
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            pEStack_48 = pEVar21;
            memset(puVar14,0,uVar17);
            uVar11 = *(undefined8 *)(puVar19 + 8);
            *(undefined8 *)puVar14 = *(undefined8 *)puVar19;
            *(undefined8 *)(puVar14 + 8) = uVar11;
            *(undefined4 *)(puVar14 + 0x10) = *(undefined4 *)(puVar19 + 0x10);
            puVar14[-8] = 0x93;
            puVar14[-7] = 't';
            puVar14[-6] = '\x17';
            puVar14[-5] = '\0';
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            memcpy(puVar14 + 0x15,puStack_70,uStack_68);
            puVar14[0x14] = '\0';
            puVar14[-8] = 0xb0;
            puVar14[-7] = 't';
            puVar14[-6] = '\x17';
            puVar14[-5] = '\0';
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            EverCrypt_HMAC_compute_sha1(puVar14,&pEStack_48->tag,0x14,puVar14,uVar20);
            puVar14[-8] = 0xc9;
            puVar14[-7] = 't';
            puVar14[-6] = '\x17';
            puVar14[-5] = '\0';
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            EverCrypt_HMAC_compute_sha1(puVar19,puVar14,0x14,puVar19,0x14);
            *(undefined4 *)((long)pEStack_48 + 0x10) = *(undefined4 *)(puVar14 + 0x10);
            uVar1 = puVar14[1];
            uVar2 = puVar14[2];
            uVar3 = puVar14[3];
            uVar4 = puVar14[4];
            uVar5 = puVar14[5];
            uVar6 = puVar14[6];
            uVar7 = puVar14[7];
            uVar11 = *(undefined8 *)(puVar14 + 8);
            pEStack_48->tag = puVar14[0];
            pEStack_48->field_0x1 = uVar1;
            pEStack_48->field_0x2 = uVar2;
            pEStack_48->field_0x3 = uVar3;
            pEStack_48->field_0x4 = uVar4;
            pEStack_48->field_0x5 = uVar5;
            pEStack_48->field_0x6 = uVar6;
            pEStack_48->field_0x7 = uVar7;
            *(undefined8 *)((long)pEStack_48 + 8) = uVar11;
            puVar14 = puVar14 + -uVar15;
            puVar14[-8] = 0xf7;
            puVar14[-7] = 't';
            puVar14[-6] = '\x17';
            puVar14[-5] = '\0';
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            memset(puVar14,0,uVar17);
            uVar11 = *(undefined8 *)(puVar19 + 8);
            *(undefined8 *)puVar14 = *(undefined8 *)puVar19;
            *(undefined8 *)(puVar14 + 8) = uVar11;
            *(undefined4 *)(puVar14 + 0x10) = *(undefined4 *)(puVar19 + 0x10);
            puVar14[-8] = '\x19';
            puVar14[-7] = 'u';
            puVar14[-6] = '\x17';
            puVar14[-5] = '\0';
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            memcpy(puVar14 + 0x15,puStack_70,uStack_68);
            puVar14[0x14] = '\x01';
            puVar14[-8] = '6';
            puVar14[-7] = 'u';
            puVar14[-6] = '\x17';
            puVar14[-5] = '\0';
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            EverCrypt_HMAC_compute_sha1(puVar14,&pEStack_48->tag,0x14,puVar14,uVar20);
            puVar14[-8] = 'O';
            puVar14[-7] = 'u';
            puVar14[-6] = '\x17';
            puVar14[-5] = '\0';
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            EverCrypt_HMAC_compute_sha1(puVar19,puVar14,0x14,puVar19,0x14);
            *(undefined4 *)((long)pEStack_48 + 0x10) = *(undefined4 *)(puVar14 + 0x10);
            uVar1 = puVar14[1];
            uVar2 = puVar14[2];
            uVar3 = puVar14[3];
            uVar4 = puVar14[4];
            uVar5 = puVar14[5];
            uVar6 = puVar14[6];
            uVar7 = puVar14[7];
            uVar11 = *(undefined8 *)(puVar14 + 8);
            pEStack_48->tag = puVar14[0];
            pEStack_48->field_0x1 = uVar1;
            pEStack_48->field_0x2 = uVar2;
            pEStack_48->field_0x3 = uVar3;
            pEStack_48->field_0x4 = uVar4;
            pEStack_48->field_0x5 = uVar5;
            pEStack_48->field_0x6 = uVar6;
            pEStack_48->field_0x7 = uVar7;
            *(undefined8 *)((long)pEStack_48 + 8) = uVar11;
            pEVar13 = pEStack_50;
            pEVar21 = pEStack_48;
          }
          pEStack_48 = pEVar21;
          puVar14 = puStack_78;
          uVar20 = uVar18 / 0x14;
          if (0x13 < uVar18) {
            lVar16 = 0;
            do {
              pEVar13[-1].field_1.case_SHA1_s.reseed_counter = (uint32_t *)0x1775a7;
              EverCrypt_HMAC_compute_sha1(puVar19,&pEStack_48->tag,0x14,puVar19,0x14);
              *(undefined4 *)(puVar14 + lVar16 + 0x10) = *(undefined4 *)(puVar19 + 0x10);
              uVar11 = *(undefined8 *)(puVar19 + 8);
              puVar12 = puVar14 + lVar16;
              *(undefined8 *)puVar12 = *(undefined8 *)puVar19;
              *(undefined8 *)(puVar12 + 8) = uVar11;
              lVar16 = lVar16 + 0x14;
            } while ((ulong)(uVar20 * 4) * 5 != lVar16);
          }
          if (uVar20 * 0x14 < (uint)lStack_80) {
            uVar18 = (uint)lStack_80 + uVar20 * -0x14;
            puVar14 = puStack_78 + uVar20 * 0x14;
            pEVar13[-1].field_1.case_SHA1_s.reseed_counter = (uint32_t *)0x1775f7;
            EverCrypt_HMAC_compute_sha1(puVar19,&pEStack_48->tag,0x14,puVar19,0x14);
            pEVar13[-1].field_1.case_SHA1_s.reseed_counter = (uint32_t *)0x177605;
            memcpy(puVar14,puVar19,(ulong)uVar18);
          }
          uVar15 = (ulong)((int)puStack_58 + 0x15);
          uVar17 = uVar15 + 0xf & 0xfffffffffffffff0;
          puVar14 = (uint8_t *)((long)pEVar13 - uVar17);
          puVar14[-8] = '1';
          puVar14[-7] = 'v';
          puVar14[-6] = '\x17';
          puVar14[-5] = '\0';
          puVar14[-4] = '\0';
          puVar14[-3] = '\0';
          puVar14[-2] = '\0';
          puVar14[-1] = '\0';
          pEStack_50 = (EverCrypt_DRBG_state_s *)uVar15;
          memset(puVar14,0,uVar15);
          pEVar21 = pEStack_48;
          *(undefined4 *)((long)pEVar13 + -uVar17 + 0x10) = *(undefined4 *)(puVar19 + 0x10);
          uVar11 = *(undefined8 *)(puVar19 + 8);
          *(undefined8 *)puVar14 = *(undefined8 *)puVar19;
          *(undefined8 *)(puVar14 + 8) = uVar11;
          if ((int)puStack_58 == 0) {
            puVar14[0x14] = '\0';
            builtin_memcpy(puVar14 + -8,"}w\x17",4);
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            EverCrypt_HMAC_compute_sha1(puVar14,&pEStack_48->tag,0x14,puVar14,(uint32_t)pEStack_50);
            puVar14[-8] = 0x96;
            puVar14[-7] = 'w';
            puVar14[-6] = '\x17';
            puVar14[-5] = '\0';
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            EverCrypt_HMAC_compute_sha1(puVar19,puVar14,0x14,puVar19,0x14);
            *(undefined4 *)((long)pEVar21 + 0x10) = *(undefined4 *)(puVar14 + 0x10);
            uVar1 = puVar14[1];
            uVar2 = puVar14[2];
            uVar3 = puVar14[3];
            uVar4 = puVar14[4];
            uVar5 = puVar14[5];
            uVar6 = puVar14[6];
            uVar7 = puVar14[7];
            uVar11 = *(undefined8 *)(puVar14 + 8);
            pEVar21->tag = puVar14[0];
            pEVar21->field_0x1 = uVar1;
            pEVar21->field_0x2 = uVar2;
            pEVar21->field_0x3 = uVar3;
            pEVar21->field_0x4 = uVar4;
            pEVar21->field_0x5 = uVar5;
            pEVar21->field_0x6 = uVar6;
            pEVar21->field_0x7 = uVar7;
            *(undefined8 *)((long)pEVar21 + 8) = uVar11;
          }
          else {
            builtin_memcpy(puVar14 + -8,"gv\x17",4);
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            lStack_80 = -uVar17;
            memcpy(puVar14 + 0x15,puStack_70,uStack_68);
            pEVar21 = pEStack_48;
            puVar14[0x14] = '\0';
            puVar14[-8] = 0x88;
            puVar14[-7] = 'v';
            puVar14[-6] = '\x17';
            puVar14[-5] = '\0';
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            EverCrypt_HMAC_compute_sha1(puVar14,&pEStack_48->tag,0x14,puVar14,(uint32_t)pEStack_50);
            puVar14[-8] = 0xa1;
            puVar14[-7] = 'v';
            puVar14[-6] = '\x17';
            puVar14[-5] = '\0';
            puVar14[-4] = '\0';
            puVar14[-3] = '\0';
            puVar14[-2] = '\0';
            puVar14[-1] = '\0';
            EverCrypt_HMAC_compute_sha1(puVar19,puVar14,0x14,puVar19,0x14);
            pEVar13 = pEStack_50;
            *(undefined4 *)((long)pEVar21 + 0x10) = *(undefined4 *)(puVar14 + 0x10);
            uVar1 = puVar14[1];
            uVar2 = puVar14[2];
            uVar3 = puVar14[3];
            uVar4 = puVar14[4];
            uVar5 = puVar14[5];
            uVar6 = puVar14[6];
            uVar7 = puVar14[7];
            uVar11 = *(undefined8 *)(puVar14 + 8);
            pEVar21->tag = puVar14[0];
            pEVar21->field_0x1 = uVar1;
            pEVar21->field_0x2 = uVar2;
            pEVar21->field_0x3 = uVar3;
            pEVar21->field_0x4 = uVar4;
            pEVar21->field_0x5 = uVar5;
            pEVar21->field_0x6 = uVar6;
            pEVar21->field_0x7 = uVar7;
            *(undefined8 *)((long)pEVar21 + 8) = uVar11;
            puVar12 = puVar14 + -uVar17;
            puVar12[-8] = 0xd5;
            puVar12[-7] = 'v';
            puVar12[-6] = '\x17';
            puVar12[-5] = '\0';
            puVar12[-4] = '\0';
            puVar12[-3] = '\0';
            puVar12[-2] = '\0';
            puVar12[-1] = '\0';
            puStack_78 = puVar14;
            puStack_58 = puVar14;
            memset(puVar12,0,(size_t)pEStack_50);
            uVar11 = *(undefined8 *)(puVar19 + 8);
            *(undefined8 *)puVar12 = *(undefined8 *)puVar19;
            *(undefined8 *)(puVar12 + 8) = uVar11;
            *(undefined4 *)(puVar12 + 0x10) = *(undefined4 *)(puVar19 + 0x10);
            puVar12[-8] = 0xf7;
            puVar12[-7] = 'v';
            puVar12[-6] = '\x17';
            puVar12[-5] = '\0';
            puVar12[-4] = '\0';
            puVar12[-3] = '\0';
            puVar12[-2] = '\0';
            puVar12[-1] = '\0';
            memcpy(puVar12 + 0x15,puStack_70,uStack_68);
            puVar12[0x14] = '\x01';
            puVar12[-8] = '\x13';
            puVar12[-7] = 'w';
            puVar12[-6] = '\x17';
            puVar12[-5] = '\0';
            puVar12[-4] = '\0';
            puVar12[-3] = '\0';
            puVar12[-2] = '\0';
            puVar12[-1] = '\0';
            EverCrypt_HMAC_compute_sha1(puVar12,&pEVar21->tag,0x14,puVar12,(uint32_t)pEVar13);
            puVar12[-8] = ',';
            puVar12[-7] = 'w';
            puVar12[-6] = '\x17';
            puVar12[-5] = '\0';
            puVar12[-4] = '\0';
            puVar12[-3] = '\0';
            puVar12[-2] = '\0';
            puVar12[-1] = '\0';
            EverCrypt_HMAC_compute_sha1(puVar19,puVar12,0x14,puVar19,0x14);
            *(undefined4 *)((long)pEVar21 + 0x10) = *(undefined4 *)(puVar12 + 0x10);
            puStack_78 = puStack_78 + lStack_80;
            uVar1 = puStack_78[1];
            uVar2 = puStack_78[2];
            uVar3 = puStack_78[3];
            uVar4 = puStack_78[4];
            uVar5 = puStack_78[5];
            uVar6 = puStack_78[6];
            uVar7 = puStack_78[7];
            uVar11 = *(undefined8 *)(puStack_78 + 8);
            pEVar21->tag = puStack_78[0];
            pEVar21->field_0x1 = uVar1;
            pEVar21->field_0x2 = uVar2;
            pEVar21->field_0x3 = uVar3;
            pEVar21->field_0x4 = uVar4;
            pEVar21->field_0x5 = uVar5;
            pEVar21->field_0x6 = uVar6;
            pEVar21->field_0x7 = uVar7;
            *(undefined8 *)((long)pEVar21 + 8) = uVar11;
          }
          *puStack_60 = *puStack_60 + 1;
          cVar10 = cStack_39;
        }
      }
    }
  }
  return (_Bool)cVar10;
}

Assistant:

bool
EverCrypt_DRBG_generate(
  uint8_t *output,
  EverCrypt_DRBG_state_s *st,
  uint32_t n,
  uint8_t *additional_input,
  uint32_t additional_input_len
)
{
  EverCrypt_DRBG_state_s scrut = *st;
  if (scrut.tag == SHA1_s)
  {
    return generate_sha1(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_256_s)
  {
    return generate_sha2_256(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_384_s)
  {
    return generate_sha2_384(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_512_s)
  {
    return generate_sha2_512(output, st, n, additional_input, additional_input_len);
  }
  KRML_HOST_EPRINTF("KaRaMeL abort at %s:%d\n%s\n",
    __FILE__,
    __LINE__,
    "unreachable (pattern matches are exhaustive in F*)");
  KRML_HOST_EXIT(255U);
}